

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O0

void __thiscall DynamicProfileStorage::StorageInfo::GetFilename(StorageInfo *this,char16 *filename)

{
  WCHAR local_228 [4];
  char16 tempFile [260];
  char16 *filename_local;
  StorageInfo *this_local;
  
  wcscpy_s<260ul>((WCHAR (*) [260])local_228,L"jsdpcache_file");
  _itow_s((this->field_1).fileId,tempFile + 10,0xf6,10);
  _wmakepath_s(filename,0x104,cacheDrive,cacheDir,local_228,L".dpd");
  return;
}

Assistant:

void DynamicProfileStorage::StorageInfo::GetFilename(_Out_writes_z_(_MAX_PATH) char16 filename[_MAX_PATH]) const
{
    char16 tempFile[_MAX_PATH];
    wcscpy_s(tempFile, _u("jsdpcache_file"));
    _itow_s(this->fileId, tempFile + _countof(_u("jsdpcache_file")) - 1, _countof(tempFile) - _countof(_u("jsdpcache_file")) + 1, 10);
    _wmakepath_s(filename, _MAX_PATH, cacheDrive, cacheDir, tempFile, _u(".dpd"));
}